

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  CommentInfo *pCVar1;
  size_t sVar2;
  
  swapPayload(this,other);
  pCVar1 = this->comments_;
  this->comments_ = other->comments_;
  other->comments_ = pCVar1;
  sVar2 = this->start_;
  this->start_ = other->start_;
  other->start_ = sVar2;
  sVar2 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = sVar2;
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}